

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

bool __thiscall
Qentem::Value<char>::
CopyValueTo<Qentem::StringStream<char>,void(Qentem::StringStream<char>&,char_const*,unsigned_int)>
          (Value<char> *this,StringStream<char> *stream,RealFormatInfo format,
          _func_void_StringStream<char>_ptr_char_ptr_uint *string_function)

{
  Value<char> *pVVar1;
  _func_void_StringStream<char>_ptr_char_ptr_uint *p_Var2;
  _func_void_StringStream<char>_ptr_char_ptr_uint *stream_00;
  ValueType VVar3;
  bool bVar4;
  SizeT SVar5;
  char *pcVar6;
  RealFormatInfo local_40;
  RealFormatInfo local_38;
  _func_void_StringStream<char>_ptr_char_ptr_uint *local_30;
  _func_void_StringStream<char>_ptr_char_ptr_uint *string_function_local;
  StringStream<char> *stream_local;
  Value<char> *this_local;
  RealFormatInfo format_local;
  
  local_30 = string_function;
  string_function_local = (_func_void_StringStream<char>_ptr_char_ptr_uint *)stream;
  stream_local = (StringStream<char> *)this;
  unique0x100001d4 = format;
  VVar3 = Type(this);
  stream_00 = string_function_local;
  p_Var2 = local_30;
  switch(VVar3) {
  case ValuePtr:
    bVar4 = CopyValueTo<Qentem::StringStream<char>,void(Qentem::StringStream<char>&,char_const*,unsigned_int)>
                      ((this->field_0).array_.storage_,(StringStream<char> *)string_function_local,
                       stack0xffffffffffffffec,local_30);
    return bVar4;
  default:
    return false;
  case String:
    if (local_30 == (_func_void_StringStream<char>_ptr_char_ptr_uint *)0x0) {
      pcVar6 = String<char>::First((String<char> *)this);
      SVar5 = String<char>::Length((String<char> *)this);
      StringStream<char>::Write((StringStream<char> *)stream_00,pcVar6,SVar5);
    }
    else {
      pcVar6 = String<char>::First((String<char> *)this);
      SVar5 = String<char>::Length((String<char> *)this);
      (*p_Var2)((StringStream<char> *)stream_00,pcVar6,SVar5);
    }
    break;
  case UIntLong:
    pVVar1 = (this->field_0).array_.storage_;
    Digit::RealFormatInfo::RealFormatInfo(&local_38);
    Digit::NumberToString<false,Qentem::StringStream<char>,unsigned_long_long>
              ((StringStream<char> *)stream_00,(unsigned_long_long)pVVar1,local_38);
    break;
  case IntLong:
    pVVar1 = (this->field_0).array_.storage_;
    Digit::RealFormatInfo::RealFormatInfo(&local_40);
    Digit::NumberToString<false,Qentem::StringStream<char>,long_long>
              ((StringStream<char> *)stream_00,(longlong)pVVar1,local_40);
    break;
  case Double:
    Digit::NumberToString<false,Qentem::StringStream<char>,double>
              ((StringStream<char> *)string_function_local,(double)(this->field_0).array_.storage_,
               stack0xffffffffffffffec);
    break;
  case True:
    StringStream<char>::Write((StringStream<char> *)string_function_local,"true",4);
    break;
  case False:
    StringStream<char>::Write((StringStream<char> *)string_function_local,"false",5);
    break;
  case Null:
    StringStream<char>::Write((StringStream<char> *)string_function_local,"null",4);
  }
  return true;
}

Assistant:

bool CopyValueTo(StringStream_T             &stream,
                     const Digit::RealFormatInfo format          = Digit::RealFormatInfo{Config::DoublePrecision},
                     StringFunction_T           *string_function = nullptr) const {
        switch (Type()) {
            case ValueType::String: {
                if (string_function != nullptr) {
                    string_function(stream, string_.First(), string_.Length());
                } else {
                    stream.Write(string_.First(), string_.Length());
                }

                break;
            }

            case ValueType::UIntLong: {
                Digit::NumberToString(stream, number_.Natural);
                break;
            }

            case ValueType::IntLong: {
                Digit::NumberToString(stream, number_.Integer);
                break;
            }

            case ValueType::Double: {
                Digit::NumberToString(stream, number_.Real, format);
                break;
            }

            case ValueType::True: {
                stream.Write(JSONotation::TrueString, JSONotation::TrueStringLength);
                break;
            }

            case ValueType::False: {
                stream.Write(JSONotation::FalseString, JSONotation::FalseStringLength);
                break;
            }

            case ValueType::Null: {
                stream.Write(JSONotation::NullString, JSONotation::NullStringLength);
                break;
            }

            case ValueType::ValuePtr: {
                return value_->CopyValueTo(stream, format, string_function);
            }

            default: {
                return false;
            }
        }

        return true;
    }